

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_must(lyd_node *node,int inout_parent,int ignore_fail)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  char *pcVar2;
  char *expr;
  int iVar3;
  lys_node *plVar4;
  lys_module *plVar5;
  uint8_t *puVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 auStack_88 [8];
  lyxp_set set;
  
  plVar4 = node->schema;
  ctx = plVar4->module->ctx;
  set.ht = (hash_table *)0x0;
  set.ctx_pos = 0;
  set.ctx_size = 0;
  set.val._8_8_ = 0;
  set.used = 0;
  set.size = 0;
  set._8_8_ = 0;
  set.val.nodes = (lyxp_set_node *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  set.type = LYXP_SET_EMPTY;
  set._4_4_ = 0;
  if (inout_parent == 0) {
    LVar1 = plVar4->nodetype;
    lVar8 = 0x1d;
    if ((int)LVar1 < 0x10) {
      if (LVar1 != LYS_CONTAINER) {
        if ((LVar1 != LYS_LEAF) && (LVar1 != LYS_LEAFLIST)) {
          return 0;
        }
        goto LAB_0011c4b9;
      }
    }
    else if ((int)LVar1 < 0x80) {
      if (LVar1 == LYS_LIST) {
        lVar8 = 0x1c;
      }
      else {
        if (LVar1 != LYS_ANYXML) {
          return 0;
        }
LAB_0011c4b9:
        lVar8 = 0x1f;
      }
    }
    else if (LVar1 != LYS_NOTIF) {
      if (LVar1 != LYS_ANYDATA) {
        return 0;
      }
      goto LAB_0011c4b9;
    }
    puVar6 = plVar4->padding + lVar8 + -0x1c;
    plVar4 = (lys_node *)&plVar4[1].dsc;
LAB_0011c4c5:
    if ((ulong)*puVar6 != 0) {
      pcVar2 = plVar4->name;
      set._56_8_ = (ulong)*puVar6 * 0x38;
      lVar8 = 0;
      do {
        expr = *(char **)(pcVar2 + lVar8);
        plVar5 = lyd_node_module(node);
        iVar3 = lyxp_eval(expr,node,LYXP_NODE_ELEM,plVar5,(lyxp_set *)auStack_88,1);
        if (iVar3 != 0) goto LAB_0011c45e;
        plVar5 = lyd_node_module(node);
        lyxp_set_cast((lyxp_set *)auStack_88,LYXP_SET_BOOLEAN,node,plVar5,1);
        if (set._8_4_ == 0) {
          if ((ignore_fail != 1) &&
             ((ignore_fail != 2 || ((*(ushort *)(pcVar2 + lVar8 + 0x32) & 0x600) == 0)))) {
            ly_vlog(ctx,LYE_NOMUST,LY_VLOG_LYD,node,*(undefined8 *)(pcVar2 + lVar8));
            if (*(char **)(pcVar2 + lVar8 + 0x20) != (char *)0x0) {
              ly_vlog_str(ctx,LY_VLOG_PREV,*(char **)(pcVar2 + lVar8 + 0x20));
            }
            if (*(char **)(pcVar2 + lVar8 + 0x18) == (char *)0x0) {
              return 1;
            }
            ly_err_last_set_apptag(ctx,*(char **)(pcVar2 + lVar8 + 0x18));
            return 1;
          }
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                 "Must condition \"%s\" not satisfied, but it is not required.",
                 *(undefined8 *)(pcVar2 + lVar8));
        }
        lVar8 = lVar8 + 0x38;
      } while (set._56_8_ != lVar8);
    }
    iVar3 = 0;
  }
  else {
    do {
      plVar4 = lys_parent(plVar4);
      if (plVar4 == (lys_node *)0x0) goto LAB_0011c439;
    } while ((plVar4->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if ((plVar4->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
LAB_0011c439:
      uVar7 = 0x1854;
    }
    else {
      node = node->parent;
      if ((node->schema->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        puVar6 = plVar4->padding + 1;
        plVar4 = plVar4 + 1;
        goto LAB_0011c4c5;
      }
      uVar7 = 0x185d;
    }
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
           ,uVar7);
LAB_0011c45e:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
resolve_must(struct lyd_node *node, int inout_parent, int ignore_fail)
{
    uint8_t i, must_size;
    struct lys_node *schema;
    struct lys_restr *must;
    struct lyxp_set set;
    struct ly_ctx *ctx = node->schema->module->ctx;

    assert(node);
    memset(&set, 0, sizeof set);

    if (inout_parent) {
        for (schema = lys_parent(node->schema);
             schema && (schema->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES));
             schema = lys_parent(schema));
        if (!schema || !(schema->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            LOGINT(ctx);
            return -1;
        }
        must_size = ((struct lys_node_inout *)schema)->must_size;
        must = ((struct lys_node_inout *)schema)->must;

        /* context node is the RPC/action */
        node = node->parent;
        if (!(node->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGINT(ctx);
            return -1;
        }
    } else {
        switch (node->schema->nodetype) {
        case LYS_CONTAINER:
            must_size = ((struct lys_node_container *)node->schema)->must_size;
            must = ((struct lys_node_container *)node->schema)->must;
            break;
        case LYS_LEAF:
            must_size = ((struct lys_node_leaf *)node->schema)->must_size;
            must = ((struct lys_node_leaf *)node->schema)->must;
            break;
        case LYS_LEAFLIST:
            must_size = ((struct lys_node_leaflist *)node->schema)->must_size;
            must = ((struct lys_node_leaflist *)node->schema)->must;
            break;
        case LYS_LIST:
            must_size = ((struct lys_node_list *)node->schema)->must_size;
            must = ((struct lys_node_list *)node->schema)->must;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            must_size = ((struct lys_node_anydata *)node->schema)->must_size;
            must = ((struct lys_node_anydata *)node->schema)->must;
            break;
        case LYS_NOTIF:
            must_size = ((struct lys_node_notif *)node->schema)->must_size;
            must = ((struct lys_node_notif *)node->schema)->must;
            break;
        default:
            must_size = 0;
            break;
        }
    }

    for (i = 0; i < must_size; ++i) {
        if (lyxp_eval(must[i].expr, node, LYXP_NODE_ELEM, lyd_node_module(node), &set, LYXP_MUST)) {
            return -1;
        }

        lyxp_set_cast(&set, LYXP_SET_BOOLEAN, node, lyd_node_module(node), LYXP_MUST);

        if (!set.val.bool) {
            if ((ignore_fail == 1) || ((must[i].flags & (LYS_XPCONF_DEP | LYS_XPSTATE_DEP)) && (ignore_fail == 2))) {
                LOGVRB("Must condition \"%s\" not satisfied, but it is not required.", must[i].expr);
            } else {
                LOGVAL(ctx, LYE_NOMUST, LY_VLOG_LYD, node, must[i].expr);
                if (must[i].emsg) {
                    ly_vlog_str(ctx, LY_VLOG_PREV, must[i].emsg);
                }
                if (must[i].eapptag) {
                    ly_err_last_set_apptag(ctx, must[i].eapptag);
                }
                return 1;
            }
        }
    }

    return EXIT_SUCCESS;
}